

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int mpt_connect(mpt_socket *sd,char *where,mpt_fdmode *mode)

{
  ushort uVar1;
  mpt_fdmode mVar2;
  undefined2 uVar3;
  int iVar4;
  int *piVar5;
  int local_38;
  int local_34;
  int sock;
  int type;
  mpt_fdmode info;
  mpt_fdmode *mode_local;
  char *where_local;
  mpt_socket *sd_local;
  
  info = (mpt_fdmode)mode;
  if (where == (char *)0x0) {
    if (-1 < sd->_id) {
      close(sd->_id);
      return 1;
    }
    return 0;
  }
  if (mode == (mpt_fdmode *)0x0) {
    local_34 = mpt_mode_parse(&sock,where);
    mVar2 = _sock;
    if (local_34 < 0) {
      piVar5 = __errno_location();
      *piVar5 = 0x16;
      return -1;
    }
    if (local_34 == 0) {
      uVar1 = (ushort)sock;
      sock._0_3_ = CONCAT12(1,uVar1 & 0xff00);
      type._2_2_ = mVar2.stream;
      stack0xffffffffffffffd3 = 0;
      iVar4 = socketSet(where,(mpt_fdmode *)&sock,bind);
      if (iVar4 < 0) {
        return iVar4;
      }
    }
  }
  else {
    _sock = *mode;
    local_34 = 0;
  }
  if ((char)sock < '\0') {
    if (((ulong)_sock & 0x20000) != 0) {
      piVar5 = __errno_location();
      *piVar5 = 0x16;
      return -1;
    }
    local_38 = open(where + local_34,(uint)sock._2_2_,(ulong)_sock >> 0x20 & 0xffff);
    if (local_38 < 0) {
      return local_38;
    }
    uVar3 = 2;
    if (((ulong)_sock & 0x10000) != 0) {
      uVar3 = 1;
    }
    _sock = (mpt_fdmode)(CONCAT26(uVar3,_sock) | 0x4000000000000);
  }
  else {
    local_38 = socketSet(where + local_34,(mpt_fdmode *)&sock,connect);
    if (local_38 < 0) {
      return local_38;
    }
  }
  if (-1 < sd->_id) {
    close(sd->_id);
  }
  sd->_id = local_38;
  return (uint)type._2_2_;
}

Assistant:

extern int mpt_connect(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode)
{
	MPT_STRUCT(fdmode) info;
	int type, sock;
	
	if (!where) {
		if (sd->_id >= 0) {
			(void) close(sd->_id);
			return 1;
		}
		return 0;
	}
	if (mode) {
		info = *mode;
		type = 0;
	}
	else if ((type = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	else if (!type) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
		if ((sock = socketSet(where, &info, bind)) < 0) {
			return sock;
		}
	}
	/* one-way type connection */
	if (info.family < 0) {
		if (info.param.file.open & O_RDWR) {
			errno = EINVAL;
			return -1;
		}
		if ((sock = open(where + type, info.param.file.open, info.param.file.perm)) < 0) {
			return sock;
		}
		info.stream  = (info.param.file.open & O_WRONLY) ? MPT_SOCKETFLAG(Write) : MPT_SOCKETFLAG(Read);
		info.stream |= MPT_SOCKETFLAG(Stream);
	}
	else if ((sock = socketSet(where + type, &info, connect)) < 0) {
		return sock;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	return info.stream;
}